

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,uint16_t *selected_algorithm,
                    ptls_buffer_t *outbuf,ptls_iovec_t input,uint16_t *algorithms,
                    size_t num_algorithms)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  EVP_PKEY *pkey;
  int iVar3;
  int iVar4;
  _func_int_st_ptls_sign_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr_ptls_buffer_t_ptr_ptls_iovec_t_uint16_t_ptr_size_t
  *p_Var5;
  EVP_MD *type;
  EVP_MD_CTX *ctx;
  ptls_buffer_t *buf;
  int iVar6;
  uint8_t *puVar7;
  size_t sVar8;
  size_t sVar9;
  size_t local_48;
  EVP_PKEY_CTX *pkey_ctx;
  ptls_buffer_t *local_38;
  
  sVar8 = input.len;
  puVar7 = input.base;
  p_Var5 = _self[2].cb;
  do {
    uVar2 = *(uint16_t *)p_Var5;
    if (uVar2 == 0xffff) {
      return 0x28;
    }
    sVar9 = 0;
    while (num_algorithms != sVar9) {
      puVar1 = algorithms + sVar9;
      sVar9 = sVar9 + 1;
      if (*puVar1 == uVar2) {
        *selected_algorithm = uVar2;
        pkey = (EVP_PKEY *)_self[1].cb;
        local_38 = outbuf;
        if (*(code **)(p_Var5 + 8) == (code *)0x0) {
          type = (EVP_MD *)0x0;
        }
        else {
          type = (EVP_MD *)(**(code **)(p_Var5 + 8))();
        }
        ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
        if (ctx == (EVP_MD_CTX *)0x0) {
          return 0x201;
        }
        iVar3 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)&pkey_ctx,type,(ENGINE *)0x0,pkey);
        iVar6 = 0x203;
        iVar4 = iVar6;
        if (iVar3 == 1) {
          iVar3 = EVP_PKEY_get_id(pkey);
          if (iVar3 == 0x43f) {
            iVar3 = EVP_DigestSign(ctx,0,&local_48,puVar7,sVar8);
            buf = local_38;
            if ((iVar3 != 1) || (iVar4 = ptls_buffer_reserve(local_38,local_48), iVar4 != 0))
            goto LAB_00104d8e;
            iVar3 = EVP_DigestSign(ctx,buf->base + buf->off,&local_48,puVar7,sVar8);
          }
          else {
            iVar3 = EVP_PKEY_get_id(pkey);
            if (((iVar3 == 6) &&
                (((iVar3 = EVP_PKEY_CTX_set_rsa_padding(pkey_ctx,6), iVar3 != 1 ||
                  (iVar3 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx,0xffffffffffffffff), iVar3 != 1
                  )) || (iVar3 = EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx,type), iVar3 != 1)))) ||
               (((iVar3 = EVP_DigestSignUpdate(ctx,puVar7,sVar8), buf = local_38, iVar3 != 1 ||
                 (iVar3 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&local_48), iVar3 != 1)) ||
                (iVar4 = ptls_buffer_reserve(buf,local_48), iVar4 != 0)))) goto LAB_00104d8e;
            iVar3 = EVP_DigestSignFinal(ctx,buf->base + buf->off,&local_48);
          }
          iVar4 = iVar6;
          if (iVar3 == 1) {
            buf->off = buf->off + local_48;
            iVar4 = 0;
          }
        }
LAB_00104d8e:
        EVP_MD_CTX_free(ctx);
        return iVar4;
      }
    }
    p_Var5 = p_Var5 + 0x10;
  } while( true );
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm (driven by server-side preference of `self->schemes`) */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, scheme, outbuf, input);
}